

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O0

vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
* parse_comma_float_array_list(char *s)

{
  int iVar1;
  char *in_RSI;
  value_type *in_RDI;
  float v_1;
  float v;
  vector<float,_std::allocator<float>_> af;
  int nscan;
  int nconsumed;
  char vstr [20];
  char *pch;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *aaf;
  float in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_40;
  int local_3c;
  undefined1 local_38 [8];
  char *in_stack_ffffffffffffffd0;
  char *local_20;
  
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)0x17b29b);
  local_20 = strtok(in_RSI,"[]");
  while (local_20 != (char *)0x0) {
    local_3c = 0;
    iVar1 = __isoc99_sscanf(local_20,"%19[^,]%n",local_38,&local_3c);
    if (iVar1 == 1) {
      local_20 = local_20 + local_3c;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x17b30d);
      vstr_to_float(in_stack_ffffffffffffffd0);
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (value_type_conflict *)in_RDI);
      local_40 = __isoc99_sscanf(local_20,",%19[^,]%n",local_38,&local_3c);
      while (local_40 == 1) {
        local_20 = local_20 + local_3c;
        in_stack_ffffffffffffff90 = vstr_to_float(in_stack_ffffffffffffffd0);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (value_type_conflict *)in_RDI);
        local_40 = __isoc99_sscanf(local_20,",%19[^,]%n",local_38,&local_3c);
      }
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::push_back((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RDI);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    }
    local_20 = strtok((char *)0x0,"[]");
  }
  return (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          *)in_RDI;
}

Assistant:

static std::vector<std::vector<float> > parse_comma_float_array_list(char* s)
{
    std::vector<std::vector<float> > aaf;

    char* pch = strtok(s, "[]");
    while (pch != NULL)
    {
        // parse a,b,c
        char vstr[20];
        int nconsumed = 0;
        int nscan = sscanf(pch, "%19[^,]%n", vstr, &nconsumed);
        if (nscan == 1)
        {
            // ok we get array
            pch += nconsumed;

            std::vector<float> af;
            float v = vstr_to_float(vstr);
            af.push_back(v);

            nscan = sscanf(pch, ",%19[^,]%n", vstr, &nconsumed);
            while (nscan == 1)
            {
                pch += nconsumed;

                float v = vstr_to_float(vstr);
                af.push_back(v);

                nscan = sscanf(pch, ",%19[^,]%n", vstr, &nconsumed);
            }

            // array end
            aaf.push_back(af);
        }

        pch = strtok(NULL, "[]");
    }

    return aaf;
}